

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_query.cpp
# Opt level: O1

spv_result_t spvtools::val::RayQueryPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  bool bVar2;
  uint32_t uVar3;
  spv_result_t sVar4;
  uint32_t uVar5;
  Op OVar6;
  Instruction *pIVar7;
  DiagnosticStream *pDVar8;
  uint32_t extraout_EDX;
  uint32_t intersection_index;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t intersection_index_00;
  uint32_t extraout_EDX_02;
  uint32_t intersection_index_01;
  uint32_t intersection_index_02;
  uint32_t intersection_index_03;
  uint32_t intersection_index_04;
  uint32_t intersection_index_05;
  uint32_t intersection_index_06;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  uint32_t num_rows;
  uint32_t component_type;
  uint32_t num_cols;
  uint32_t col_type;
  undefined8 local_218;
  uint32_t local_20c;
  uint32_t local_208 [2];
  DiagnosticStream local_200;
  
  uVar1 = (inst->inst_).opcode;
  uVar5 = (inst->inst_).type_id;
  uVar11 = (uint)uVar1;
  if (0x177f < uVar1) {
    switch(uVar1) {
    case 0x1780:
    case 0x1782:
      sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      bVar2 = ValidationState_t::IsFloatScalarType(_,uVar5);
      if ((!bVar2) || (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 != 0x20)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar10 = "expected Result Type to be 32-bit float scalar type";
        lVar9 = 0x33;
        goto LAB_0069fd54;
      }
      uVar5 = extraout_EDX_02;
      if (uVar11 != 0x1782) {
        return SPV_SUCCESS;
      }
      break;
    case 0x1781:
    case 0x1783:
    case 0x1784:
    case 0x1785:
    case 0x1786:
    case 0x1787:
switchD_0069f3ea_caseD_1781:
      sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      bVar2 = ValidationState_t::IsIntScalarType(_,uVar5);
      if ((!bVar2) || (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 != 0x20)) {
LAB_0069f7b5:
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar10 = "expected Result Type to be 32-bit int scalar type";
        lVar9 = 0x31;
        goto LAB_0069fd54;
      }
      uVar5 = extraout_EDX;
      if (uVar11 == 0x1781) {
        return SPV_SUCCESS;
      }
      break;
    case 0x1788:
      sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      sVar4 = anon_unknown_2::ValidateIntersectionId(_,inst,intersection_index_06);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      bVar2 = ValidationState_t::IsFloatVectorType(_,uVar5);
      if (((bVar2) && (uVar3 = ValidationState_t::GetDimension(_,uVar5), uVar3 == 2)) &&
         (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar10 = "expected Result Type to be 32-bit float 2-component vector type";
LAB_0069fa00:
      lVar9 = 0x3f;
      goto LAB_0069fd54;
    case 0x1789:
    case 0x178a:
switchD_0069f3ea_caseD_1789:
      sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      bVar2 = ValidationState_t::IsBoolScalarType(_,uVar5);
      if (!bVar2) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar10 = "expected Result Type to be bool scalar type";
        lVar9 = 0x2b;
        goto LAB_0069fd54;
      }
      uVar5 = extraout_EDX_01;
      if (uVar11 != 0x1789) {
        return SPV_SUCCESS;
      }
      break;
    case 0x178b:
    case 0x178c:
    case 0x178d:
    case 0x178e:
      sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      bVar2 = ValidationState_t::IsFloatVectorType(_,uVar5);
      if (((!bVar2) || (uVar3 = ValidationState_t::GetDimension(_,uVar5), uVar3 != 3)) ||
         (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 != 0x20)) goto LAB_0069f9e1;
      uVar5 = extraout_EDX_00;
      if (1 < uVar11 - 0x178b) {
        return SPV_SUCCESS;
      }
      break;
    case 0x178f:
    case 0x1790:
      sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      sVar4 = anon_unknown_2::ValidateIntersectionId(_,inst,intersection_index_01);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      local_218 = (char *)((ulong)local_218._4_4_ << 0x20);
      local_208[0] = 0;
      local_208[1] = 0;
      local_20c = 0;
      bVar2 = ValidationState_t::GetMatrixTypeInfo
                        (_,uVar5,(uint32_t *)&local_218,local_208,local_208 + 1,&local_20c);
      if (bVar2) {
        if (local_208[0] == 4) {
          bVar2 = ValidationState_t::IsFloatScalarType(_,local_20c);
          if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
            bVar2 = true;
            sVar4 = SPV_SUCCESS;
            if ((uint32_t)local_218 == 3) goto joined_r0x0069fdd2;
          }
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar10 = 
          "expected Result Type matrix to have a Column Type of 3-component 32-bit float vectors";
          lVar9 = 0x55;
        }
        else {
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar10 = "expected Result Type matrix to have a Column Count of 4";
          lVar9 = 0x37;
        }
      }
      else {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar10 = "expected matrix type as Result Type";
        lVar9 = 0x23;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar10,lVar9);
      DiagnosticStream::~DiagnosticStream(&local_200);
      bVar2 = false;
      sVar4 = local_200.error_;
      goto joined_r0x0069fdd2;
    default:
      goto LAB_0069fdd6;
    }
    sVar4 = anon_unknown_2::ValidateIntersectionId(_,inst,uVar5);
joined_r0x0069f47c:
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
LAB_0069fdd6:
    return SPV_SUCCESS;
  }
  switch(uVar1) {
  case 0x1533:
    sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    sVar4 = anon_unknown_2::ValidateIntersectionId(_,inst,intersection_index_05);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    bVar2 = ValidationState_t::IsFloatVectorType(_,uVar5);
    if (((bVar2) && (uVar3 = ValidationState_t::GetDimension(_,uVar5), uVar3 == 3)) &&
       (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
      return SPV_SUCCESS;
    }
LAB_0069f9e1:
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar10 = "expected Result Type to be 32-bit float 3-component vector type";
    goto LAB_0069fa00;
  case 0x1534:
  case 0x1537:
    sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    sVar4 = anon_unknown_2::ValidateIntersectionId(_,inst,intersection_index);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    bVar2 = ValidationState_t::IsFloatScalarType(_,uVar5);
    if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar10 = "expected Result Type to be 32-bit floating point scalar type";
    lVar9 = 0x3c;
    break;
  case 0x1535:
    sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    sVar4 = anon_unknown_2::ValidateIntersectionId(_,inst,intersection_index_03);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    pIVar7 = ValidationState_t::FindDef(_,uVar5);
    if (((pIVar7->inst_).opcode == 0x1c) &&
       (uVar3 = anon_unknown_2::GetArrayLength(_,pIVar7), uVar3 == 2)) {
      uVar3 = ValidationState_t::GetComponentType(_,uVar5);
      bVar2 = ValidationState_t::IsFloatVectorType(_,uVar3);
      if (bVar2) {
        uVar5 = ValidationState_t::GetComponentType(_,uVar5);
        uVar5 = ValidationState_t::GetDimension(_,uVar5);
        bVar2 = true;
        sVar4 = SPV_SUCCESS;
        if (uVar5 == 3) goto joined_r0x0069fdd2;
      }
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,
               "Expected 2 element array of 32-bit 3 component float point vector as Result Type: ",
               0x52);
    local_218 = spvOpcodeString(OpRayQueryGetIntersectionLSSPositionsNV);
    pDVar8 = DiagnosticStream::operator<<(&local_200,(char **)&local_218);
    local_200.error_ = pDVar8->error_;
    goto LAB_0069fdc6;
  case 0x1536:
    sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    sVar4 = anon_unknown_2::ValidateIntersectionId(_,inst,intersection_index_04);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    bVar2 = ValidationState_t::IsFloatArrayType(_,uVar5);
    if (bVar2) {
      pIVar7 = ValidationState_t::FindDef(_,uVar5);
      uVar3 = anon_unknown_2::GetArrayLength(_,pIVar7);
      if (uVar3 == 2) {
        uVar5 = ValidationState_t::GetComponentType(_,uVar5);
        bVar2 = ValidationState_t::IsFloatScalarType(_,uVar5);
        if (bVar2) {
          return SPV_SUCCESS;
        }
      }
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,"Expected 32-bit floating point scalar as Result Type: ",0x36);
    local_218 = spvOpcodeString(OpRayQueryGetIntersectionLSSRadiiNV);
    pDVar8 = DiagnosticStream::operator<<(&local_200,(char **)&local_218);
    local_200.error_ = pDVar8->error_;
    goto LAB_0069fd63;
  case 0x1538:
  case 0x1539:
  case 0x153a:
  case 0x153b:
  case 0x153c:
  case 0x153d:
    goto LAB_0069fdd6;
  case 0x153e:
  case 0x153f:
    sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    sVar4 = anon_unknown_2::ValidateIntersectionId(_,inst,intersection_index_00);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    bVar2 = ValidationState_t::IsBoolScalarType(_,uVar5);
    if (bVar2) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar10 = "expected Result Type to be Boolean scalar type";
    lVar9 = 0x2e;
    break;
  default:
    switch(uVar1) {
    case 0x1179:
      goto switchD_0069f46b_caseD_1179;
    case 0x117a:
    case 0x117c:
      sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,0);
      goto joined_r0x0069f47c;
    case 0x117b:
      sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,0);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      uVar5 = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar2 = ValidationState_t::IsFloatScalarType(_,uVar5);
      if (bVar2) {
        uVar5 = ValidationState_t::GetBitWidth(_,uVar5);
        bVar2 = true;
        sVar4 = SPV_SUCCESS;
        if (uVar5 == 0x20) goto joined_r0x0069fdd2;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar10 = "Hit T must be a 32-bit float scalar";
      lVar9 = 0x23;
      goto LAB_0069fdb7;
    case 0x117d:
      goto switchD_0069f3ea_caseD_1789;
    case 0x117e:
      goto LAB_0069fdd6;
    case 0x117f:
      goto switchD_0069f3ea_caseD_1781;
    default:
      if (uVar1 != 0x14e1) {
        return SPV_SUCCESS;
      }
      sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,2);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      sVar4 = anon_unknown_2::ValidateIntersectionId(_,inst,intersection_index_02);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      bVar2 = ValidationState_t::IsIntScalarType(_,uVar5);
      if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
        return SPV_SUCCESS;
      }
      goto LAB_0069f7b5;
    }
  }
LAB_0069fd54:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar10,lVar9);
LAB_0069fd63:
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
switchD_0069f46b_caseD_1179:
  sVar4 = anon_unknown_2::ValidateRayQueryPointer(_,inst,0);
  if (sVar4 != SPV_SUCCESS) {
    return sVar4;
  }
  uVar5 = ValidationState_t::GetOperandTypeId(_,inst,1);
  OVar6 = ValidationState_t::GetIdOpcode(_,uVar5);
  if (OVar6 != OpTypeAccelerationStructureKHR) {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar10 = "Expected Acceleration Structure to be of type OpTypeAccelerationStructureKHR";
    lVar9 = 0x4c;
    goto LAB_0069fd54;
  }
  uVar5 = ValidationState_t::GetOperandTypeId(_,inst,2);
  bVar2 = ValidationState_t::IsIntScalarType(_,uVar5);
  if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
    uVar5 = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar2 = ValidationState_t::IsIntScalarType(_,uVar5);
    if ((!bVar2) || (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 != 0x20)) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar10 = "Cull Mask must be a 32-bit int scalar";
      goto LAB_0069fdb2;
    }
    uVar5 = ValidationState_t::GetOperandTypeId(_,inst,4);
    bVar2 = ValidationState_t::IsFloatVectorType(_,uVar5);
    if (((bVar2) && (uVar3 = ValidationState_t::GetDimension(_,uVar5), uVar3 == 3)) &&
       (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
      uVar5 = ValidationState_t::GetOperandTypeId(_,inst,5);
      bVar2 = ValidationState_t::IsFloatScalarType(_,uVar5);
      if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
        uVar5 = ValidationState_t::GetOperandTypeId(_,inst,6);
        bVar2 = ValidationState_t::IsFloatVectorType(_,uVar5);
        if (((!bVar2) || (uVar3 = ValidationState_t::GetDimension(_,uVar5), uVar3 != 3)) ||
           (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 != 0x20)) {
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar10 = "Ray Direction must be a 32-bit float 3-component vector";
          lVar9 = 0x37;
          goto LAB_0069fdb7;
        }
        uVar5 = ValidationState_t::GetOperandTypeId(_,inst,7);
        bVar2 = ValidationState_t::IsFloatScalarType(_,uVar5);
        if (bVar2) {
          uVar5 = ValidationState_t::GetBitWidth(_,uVar5);
          bVar2 = true;
          sVar4 = SPV_SUCCESS;
          if (uVar5 == 0x20) goto joined_r0x0069fdd2;
        }
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar10 = "Ray TMax must be a 32-bit float scalar";
      }
      else {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar10 = "Ray TMin must be a 32-bit float scalar";
      }
      lVar9 = 0x26;
    }
    else {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar10 = "Ray Origin must be a 32-bit float 3-component vector";
      lVar9 = 0x34;
    }
  }
  else {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar10 = "Ray Flags must be a 32-bit int scalar";
LAB_0069fdb2:
    lVar9 = 0x25;
  }
LAB_0069fdb7:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar10,lVar9);
LAB_0069fdc6:
  DiagnosticStream::~DiagnosticStream(&local_200);
  bVar2 = false;
  sVar4 = local_200.error_;
joined_r0x0069fdd2:
  if (bVar2) {
    return SPV_SUCCESS;
  }
  return sVar4;
}

Assistant:

spv_result_t RayQueryPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  switch (opcode) {
    case spv::Op::OpRayQueryInitializeKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 0)) return error;

      if (_.GetIdOpcode(_.GetOperandTypeId(inst, 1)) !=
          spv::Op::OpTypeAccelerationStructureKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Acceleration Structure to be of type "
                  "OpTypeAccelerationStructureKHR";
      }

      const uint32_t ray_flags = _.GetOperandTypeId(inst, 2);
      if (!_.IsIntScalarType(ray_flags) || _.GetBitWidth(ray_flags) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Flags must be a 32-bit int scalar";
      }

      const uint32_t cull_mask = _.GetOperandTypeId(inst, 3);
      if (!_.IsIntScalarType(cull_mask) || _.GetBitWidth(cull_mask) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Cull Mask must be a 32-bit int scalar";
      }

      const uint32_t ray_origin = _.GetOperandTypeId(inst, 4);
      if (!_.IsFloatVectorType(ray_origin) || _.GetDimension(ray_origin) != 3 ||
          _.GetBitWidth(ray_origin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Origin must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmin = _.GetOperandTypeId(inst, 5);
      if (!_.IsFloatScalarType(ray_tmin) || _.GetBitWidth(ray_tmin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMin must be a 32-bit float scalar";
      }

      const uint32_t ray_direction = _.GetOperandTypeId(inst, 6);
      if (!_.IsFloatVectorType(ray_direction) ||
          _.GetDimension(ray_direction) != 3 ||
          _.GetBitWidth(ray_direction) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Direction must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmax = _.GetOperandTypeId(inst, 7);
      if (!_.IsFloatScalarType(ray_tmax) || _.GetBitWidth(ray_tmax) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMax must be a 32-bit float scalar";
      }
      break;
    }

    case spv::Op::OpRayQueryTerminateKHR:
    case spv::Op::OpRayQueryConfirmIntersectionKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 0)) return error;
      break;
    }

    case spv::Op::OpRayQueryGenerateIntersectionKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 0)) return error;

      const uint32_t hit_t_id = _.GetOperandTypeId(inst, 1);
      if (!_.IsFloatScalarType(hit_t_id) || _.GetBitWidth(hit_t_id) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit T must be a 32-bit float scalar";
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionFrontFaceKHR:
    case spv::Op::OpRayQueryProceedKHR:
    case spv::Op::OpRayQueryGetIntersectionCandidateAABBOpaqueKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;

      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be bool scalar type";
      }

      if (opcode == spv::Op::OpRayQueryGetIntersectionFrontFaceKHR) {
        if (auto error = ValidateIntersectionId(_, inst, 3)) return error;
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionTKHR:
    case spv::Op::OpRayQueryGetRayTMinKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;

      if (!_.IsFloatScalarType(result_type) ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit float scalar type";
      }

      if (opcode == spv::Op::OpRayQueryGetIntersectionTKHR) {
        if (auto error = ValidateIntersectionId(_, inst, 3)) return error;
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionTypeKHR:
    case spv::Op::OpRayQueryGetIntersectionInstanceCustomIndexKHR:
    case spv::Op::OpRayQueryGetIntersectionInstanceIdKHR:
    case spv::Op::
        OpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetKHR:
    case spv::Op::OpRayQueryGetIntersectionGeometryIndexKHR:
    case spv::Op::OpRayQueryGetIntersectionPrimitiveIndexKHR:
    case spv::Op::OpRayQueryGetRayFlagsKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;

      if (!_.IsIntScalarType(result_type) || _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit int scalar type";
      }

      if (opcode != spv::Op::OpRayQueryGetRayFlagsKHR) {
        if (auto error = ValidateIntersectionId(_, inst, 3)) return error;
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionObjectRayDirectionKHR:
    case spv::Op::OpRayQueryGetIntersectionObjectRayOriginKHR:
    case spv::Op::OpRayQueryGetWorldRayDirectionKHR:
    case spv::Op::OpRayQueryGetWorldRayOriginKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;

      if (!_.IsFloatVectorType(result_type) ||
          _.GetDimension(result_type) != 3 ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit float 3-component "
                  "vector type";
      }

      if (opcode == spv::Op::OpRayQueryGetIntersectionObjectRayDirectionKHR ||
          opcode == spv::Op::OpRayQueryGetIntersectionObjectRayOriginKHR) {
        if (auto error = ValidateIntersectionId(_, inst, 3)) return error;
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionBarycentricsKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      if (!_.IsFloatVectorType(result_type) ||
          _.GetDimension(result_type) != 2 ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit float 2-component "
                  "vector type";
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionObjectToWorldKHR:
    case spv::Op::OpRayQueryGetIntersectionWorldToObjectKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      uint32_t num_rows = 0;
      uint32_t num_cols = 0;
      uint32_t col_type = 0;
      uint32_t component_type = 0;
      if (!_.GetMatrixTypeInfo(result_type, &num_rows, &num_cols, &col_type,
                               &component_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected matrix type as Result Type";
      }

      if (num_cols != 4) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type matrix to have a Column Count of 4";
      }

      if (!_.IsFloatScalarType(component_type) ||
          _.GetBitWidth(result_type) != 32 || num_rows != 3) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type matrix to have a Column Type of "
                  "3-component 32-bit float vectors";
      }
      break;
    }

    case spv::Op::OpRayQueryGetClusterIdNV: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      if (!_.IsIntScalarType(result_type) || _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit int scalar type";
      }
      break;
    }

    case spv::Op::OpRayQueryGetIntersectionSpherePositionNV: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      if (!_.IsFloatVectorType(result_type) ||
          _.GetDimension(result_type) != 3 ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit float 3-component "
                  "vector type";
      }
      break;
    }

    case spv::Op::OpRayQueryGetIntersectionLSSPositionsNV: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      auto result_id = _.FindDef(result_type);
      if ((result_id->opcode() != spv::Op::OpTypeArray) ||
          (GetArrayLength(_, result_id) != 2) ||
          !_.IsFloatVectorType(_.GetComponentType(result_type)) ||
          _.GetDimension(_.GetComponentType(result_type)) != 3) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 2 element array of 32-bit 3 component float point "
                  "vector as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpRayQueryGetIntersectionLSSRadiiNV: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      if (!_.IsFloatArrayType(result_type) ||
          (GetArrayLength(_, _.FindDef(result_type)) != 2) ||
          !_.IsFloatScalarType(_.GetComponentType(result_type))) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit floating point scalar as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpRayQueryGetIntersectionSphereRadiusNV:
    case spv::Op::OpRayQueryGetIntersectionLSSHitValueNV: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      if (!_.IsFloatScalarType(result_type) ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit floating point "
                  "scalar type";
      }
      break;
    }

    case spv::Op::OpRayQueryIsSphereHitNV:
    case spv::Op::OpRayQueryIsLSSHitNV: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be Boolean "
                  "scalar type";
      }

      break;
    }
    default:
      break;
  }

  return SPV_SUCCESS;
}